

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall Fl_Window::show(Fl_Window *this)

{
  uchar uVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  Fl_Color i;
  ulong uVar4;
  Fl_Window *this_local;
  
  Fl_Widget::image((Fl_Widget *)this,Fl::scheme_bg_);
  if (Fl::scheme_bg_ == (Fl_Image *)0x0) {
    Fl_Widget::labeltype((Fl_Widget *)this,FL_NO_LABEL);
  }
  else {
    Fl_Widget::labeltype((Fl_Widget *)this,FL_NORMAL_LABEL);
    Fl_Widget::align((Fl_Widget *)this,0x50);
  }
  (*Fl_Tooltip::exit)((Fl_Widget *)this);
  iVar2 = shown(this);
  if (iVar2 == 0) {
    fl_open_display();
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 != 0xf1) {
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      iVar2 = can_boxcheat((uchar)FVar3);
      if (iVar2 != 0) {
        i = Fl_Widget::color((Fl_Widget *)this);
        uVar4 = fl_xpixel(i);
        fl_background_pixel = (int)uVar4;
      }
    }
    Fl_X::make_xid(this,fl_visual,fl_colormap);
  }
  else {
    XMapRaised(fl_display,this->i->xid);
  }
  return;
}

Assistant:

void Fl_Window::show() {
  image(Fl::scheme_bg_);
  if (Fl::scheme_bg_) {
    labeltype(FL_NORMAL_LABEL);
    align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
  } else {
    labeltype(FL_NO_LABEL);
  }
  Fl_Tooltip::exit(this);
  if (!shown()) {
    fl_open_display();
    // Don't set background pixel for double-buffered windows...
    if (type() != FL_DOUBLE_WINDOW && can_boxcheat(box())) {
      fl_background_pixel = int(fl_xpixel(color()));
    }
    Fl_X::make_xid(this);
  } else {
    XMapRaised(fl_display, i->xid);
  }
#ifdef USE_PRINT_BUTTON
void preparePrintFront(void);
preparePrintFront();
#endif
}